

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basis.cc
# Opt level: O1

void __thiscall ipx::Basis::ConstructBasisFromWeights(Basis *this,double *colscale,Info *info)

{
  int iVar1;
  Control *this_00;
  ostream *poVar2;
  fmtflags in_R8D;
  char local_99;
  double local_98;
  string local_90;
  string local_70;
  string local_50;
  
  (info->super_ipx_info).errflag = 0;
  (info->super_ipx_info).dependent_rows = 0;
  (info->super_ipx_info).dependent_cols = 0;
  if ((this->control_->parameters_).super_ipx_parameters.crash_basis != 0) {
    CrashBasis(this,colscale);
    local_98 = MinSingularValue(this);
    poVar2 = Control::Debug(this->control_,1);
    Textline<char[39]>(&local_70,(char (*) [39])"Minimum singular value of crash basis:");
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar2,local_70._M_dataplus._M_p,local_70._M_string_length);
    Format_abi_cxx11_(&local_90,(ipx *)0x0,local_98,2,0x100,in_R8D);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar2,local_90._M_dataplus._M_p,local_90._M_string_length);
    local_99 = '\n';
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_99,1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    Repair(this,info);
    iVar1 = (info->super_ipx_info).basis_repairs;
    if (-1 < iVar1) {
      if (iVar1 != 0) {
        local_98 = MinSingularValue(this);
        poVar2 = Control::Debug(this->control_,1);
        Textline<char[48]>(&local_70,
                           (char (*) [48])"Minimum singular value of repaired crash basis:");
        poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar2,local_70._M_dataplus._M_p,local_70._M_string_length);
        Format_abi_cxx11_(&local_90,(ipx *)0x0,local_98,2,0x100,in_R8D);
        poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar2,local_90._M_dataplus._M_p,local_90._M_string_length);
        local_99 = '\n';
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_99,1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2) {
          operator_delete(local_90._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p);
        }
      }
      goto LAB_00394a8e;
    }
    this_00 = this->control_;
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50," discarding crash basis\n","");
    Control::hLog(this_00,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
  }
  SetToSlackBasis(this);
LAB_00394a8e:
  PivotFreeVariablesIntoBasis(this,colscale,info);
  if ((info->super_ipx_info).errflag == 0) {
    PivotFixedVariablesOutOfBasis(this,colscale,info);
  }
  return;
}

Assistant:

void Basis::ConstructBasisFromWeights(const double* colscale, Info* info) {
    assert(colscale);
    info->errflag = 0;
    info->dependent_rows = 0;
    info->dependent_cols = 0;

    if (control_.crash_basis()) {
        CrashBasis(colscale);
        double sigma = MinSingularValue();
        control_.Debug()
            << Textline("Minimum singular value of crash basis:") << sci2(sigma)
            << '\n';
        Repair(info);
        if (info->basis_repairs < 0) {
	  control_.hLog(" discarding crash basis\n");
            SetToSlackBasis();
        }
        else if (info->basis_repairs > 0) {
            sigma = MinSingularValue();
            control_.Debug()
                << Textline("Minimum singular value of repaired crash basis:")
                << sci2(sigma) << '\n';
        }
    } else {
        SetToSlackBasis();
    }
    PivotFreeVariablesIntoBasis(colscale, info);
    if (info->errflag)
        return;
    PivotFixedVariablesOutOfBasis(colscale, info);
    if (info->errflag)
        return;
}